

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::CBStringList::split(CBStringList *this,CBStream *b,uchar splitChar)

{
  int iVar1;
  CBStringException *this_00;
  CBString sc;
  CBStringException bstr__cppwrapper_exception;
  CBString local_70;
  string local_58;
  CBStringException local_38;
  
  CBString::CBString(&local_70,splitChar);
  iVar1 = bssplitscb(b->m_s,&local_70.super_tagbstring,streamSplitCb,this);
  if (-1 < iVar1) {
    local_70._vptr_CBString = (_func_int **)&PTR__CBString_001a9830;
    if (local_70.super_tagbstring.data != (uchar *)0x0) {
      free(local_70.super_tagbstring.data);
    }
    return;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"CBString::Split bstream failure","");
  CBStringException::CBStringException(&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&local_38);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBStringList::split (const CBStream& b, unsigned char splitChar) {
CBString sc (splitChar);
	if (0 > bssplitscb (b.m_s, (bstring) &sc,
	                    streamSplitCb, (void *) this)) {
		bstringThrow ("Split bstream failure");
	}
}